

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  seqStore_t *seqStore;
  ZSTD_fseCTables_t *prevCTable;
  FSE_CTable *pFVar1;
  byte bVar2;
  byte bVar3;
  ZSTD_strategy ZVar4;
  ZSTD_literalCompressionMode_e ZVar5;
  HUF_repeat HVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  BYTE *pBVar8;
  seqDef *sequences;
  seqDef *psVar9;
  BYTE *codeTable;
  symbolEncodingType_e sVar10;
  uint uVar11;
  size_t err_code_2;
  size_t __n;
  ulong uVar12;
  long lVar13;
  ulong *puVar14;
  ZSTD_compressedBlockState_t *pZVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  U32 *pUVar20;
  uint uVar21;
  ulong *puVar22;
  BYTE *pBVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  ulong *puVar27;
  bool bVar28;
  U32 UVar29;
  rawSeqStore_t *rawSeqStore;
  uint uVar30;
  long lVar31;
  size_t err_code_1;
  ulong *puVar32;
  FSE_CTable *prevCTable_00;
  ulong uVar33;
  ulong *puVar34;
  BYTE *istart;
  byte *pbVar35;
  bool bVar36;
  size_t sVar37;
  uint max;
  undefined4 uStack_1c4;
  uint local_1c0;
  ulong *local_1b8;
  ulong *local_1b0;
  ulong *local_1a8;
  FSE_CTable *local_1a0;
  BYTE *local_198;
  symbolEncodingType_e local_190;
  uint local_18c;
  ulong local_188;
  ZSTD_fseCTables_t *local_180;
  ulong local_178;
  ulong local_170;
  FSE_CState_t local_168;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  uint count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar7 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar7->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    uVar17 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar29 = (zc->blockState).matchState.nextToUpdate;
    if (UVar29 + 0x180 < uVar17) {
      uVar30 = (uVar17 - UVar29) - 0x180;
      if (0xbf < uVar30) {
        uVar30 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar17 - uVar30;
    }
    if ((zc->blockState).matchState.window.lowLimit < (zc->blockState).matchState.window.dictLimit)
    {
      uVar24 = 1;
    }
    else {
      uVar24 = (ulong)((uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0
                             ) * 2);
    }
    ms = &(zc->blockState).matchState;
    seqStore = &zc->seqStore;
    pUVar20 = ((zc->blockState).nextCBlock)->rep;
    for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
      pUVar20[lVar31] = pZVar7->rep[lVar31];
    }
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      rawSeqStore = &zc->externSeqStore;
LAB_0010cf87:
      __n = ZSTD_ldm_blockCompress(rawSeqStore,ms,seqStore,pUVar20,src,srcSize);
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm != 0) {
        count[2] = 0;
        count[3] = 0;
        count[4] = 0;
        count[5] = 0;
        count._0_8_ = zc->ldmSequences;
        count._24_8_ = zc->maxNbLdmSequences;
        sVar26 = ZSTD_ldm_generateSequences
                           (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                            srcSize);
        if (0xffffffffffffff88 < sVar26) {
          return sVar26;
        }
        pUVar20 = ((zc->blockState).nextCBlock)->rep;
        rawSeqStore = (rawSeqStore_t *)count;
        goto LAB_0010cf87;
      }
      __n = (*ZSTD_selectBlockCompressor::blockCompressor[uVar24]
              [(int)(zc->appliedParams).cParams.strategy])(ms,seqStore,pUVar20,src,srcSize);
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
    pBVar23 = (zc->seqStore).lit + __n;
    (zc->seqStore).lit = pBVar23;
    pZVar7 = (zc->blockState).prevCBlock;
    pZVar15 = (zc->blockState).nextCBlock;
    local_18c = (zc->appliedParams).cParams.windowLog;
    bVar36 = 0x39 < local_18c;
    ZVar4 = (zc->appliedParams).cParams.strategy;
    local_188 = (ulong)ZVar4;
    pBVar8 = (zc->seqStore).litStart;
    uVar24 = (long)pBVar23 - (long)pBVar8;
    ZVar5 = (zc->appliedParams).literalCompressionMode;
    bVar28 = true;
    if (ZVar5 != ZSTD_lcm_huffman) {
      if (ZVar5 == ZSTD_lcm_uncompressed) {
        bVar28 = false;
      }
      else if (ZVar4 == ZSTD_fast) {
        bVar28 = (zc->appliedParams).cParams.targetLength == 0;
      }
    }
    sequences = (zc->seqStore).sequencesStart;
    psVar9 = (zc->seqStore).sequences;
    pUVar20 = zc->entropyWorkspace;
    local_178 = (ulong)(uint)zc->bmi2;
    pBVar23 = (zc->seqStore).ofCode;
    bVar16 = (char)ZVar4 - 1;
    if (ZVar4 < ZSTD_btultra) {
      bVar16 = 6;
    }
    local_198 = (zc->seqStore).llCode;
    codeTable = (zc->seqStore).mlCode;
    memcpy(pZVar15,pZVar7,0x404);
    if (bVar28) {
      HVar6 = (pZVar7->entropy).huf.repeatMode;
      uVar33 = 0x3f;
      if (HVar6 == HUF_repeat_valid) {
        uVar33 = 6;
      }
      if (uVar24 <= uVar33) goto LAB_0010d2aa;
      uVar33 = ((ulong)(0x3ff < uVar24) - (ulong)(uVar24 < 0x4000)) + 4;
      sVar26 = dstCapacity - uVar33;
      if (uVar33 <= dstCapacity && sVar26 != 0) {
        _max = CONCAT44(uStack_1c4,HVar6);
        bVar28 = uVar24 < 0x401 && (uint)local_188 < 4;
        local_1a0 = (FSE_CTable *)
                    CONCAT71(local_1a0._1_7_,
                             uVar33 == 3 && HVar6 == HUF_repeat_valid || uVar24 < 0x100);
        if (uVar33 == 3 && HVar6 == HUF_repeat_valid || uVar24 < 0x100) {
          uVar12 = HUF_compress1X_repeat
                             ((void *)((long)dst + uVar33),sVar26,pBVar8,uVar24,0xff,0xb,pUVar20,
                              0x1800,(HUF_CElt *)pZVar15,&max,(uint)bVar28,(int)local_178);
        }
        else {
          uVar12 = HUF_compress4X_repeat
                             ((void *)((long)dst + uVar33),sVar26,pBVar8,uVar24,0xff,0xb,pUVar20,
                              0x1800,(HUF_CElt *)pZVar15,&max,(uint)bVar28,(int)local_178);
        }
        uVar17 = 3 - (max == 0);
        if ((uVar24 - (uVar24 >> (bVar16 & 0x3f))) - 2 <= uVar12 || 0xffffffffffffff87 < uVar12 - 1)
        {
          memcpy(pZVar15,pZVar7,0x404);
          goto LAB_0010d2aa;
        }
        iVar19 = (int)uVar24;
        if (uVar12 != 1) {
          if (max == 0) {
            (pZVar15->entropy).huf.repeatMode = HUF_repeat_check;
          }
          iVar18 = (int)uVar12;
          if (uVar33 == 5) {
            *(uint *)dst = iVar18 * 0x400000 + iVar19 * 0x10 | uVar17 | 0xc;
            *(char *)((long)dst + 4) = (char)(uVar12 >> 10);
          }
          else if (uVar33 == 4) {
            *(uint *)dst = iVar18 * 0x40000 + iVar19 * 0x10 | uVar17 | 8;
          }
          else {
            iVar19 = iVar18 * 0x4000 + ((uVar17 | iVar19 * 0x10 + (uint)(byte)local_1a0 * 4) ^ 4);
            *(short *)dst = (short)iVar19;
            *(char *)((long)dst + 2) = (char)((uint)iVar19 >> 0x10);
          }
          uVar12 = uVar12 + uVar33;
          goto LAB_0010d2cb;
        }
        memcpy(pZVar15,pZVar7,0x404);
        lVar31 = ((ulong)(0x1f < uVar24) + 1) - (ulong)(uVar24 < 0x1000);
        lVar13 = lVar31 + 1;
        if (lVar13 == 3) {
          *(uint *)dst = iVar19 << 4 | 0xd;
        }
        else if ((int)lVar13 == 2) {
          *(ushort *)dst = (ushort)(iVar19 << 4) | 5;
        }
        else {
          *(char *)dst = (char)uVar24 * '\b' + '\x01';
        }
        *(BYTE *)((long)dst + lVar13) = *pBVar8;
        uVar24 = (ulong)((int)lVar31 + 2);
        goto LAB_0010d2d8;
      }
      uVar12 = 0xffffffffffffffba;
    }
    else {
LAB_0010d2aa:
      uVar12 = ZSTD_noCompressLiterals(dst,dstCapacity,pBVar8,uVar24);
LAB_0010d2cb:
      uVar24 = uVar12;
      if (uVar12 < 0xffffffffffffff89) {
LAB_0010d2d8:
        uVar12 = 0xffffffffffffffba;
        if (3 < (long)(dstCapacity - uVar24)) {
          uVar33 = (long)psVar9 - (long)sequences >> 3;
          pbVar35 = (byte *)(uVar24 + (long)dst);
          if (uVar33 < 0x7f) {
            *pbVar35 = (byte)uVar33;
            pbVar35 = pbVar35 + 1;
          }
          else if (uVar33 < 0x7f00) {
            *pbVar35 = (byte)(uVar33 >> 8) | 0x80;
            pbVar35[1] = (byte)uVar33;
            pbVar35 = pbVar35 + 2;
          }
          else {
            *pbVar35 = 0xff;
            *(short *)(pbVar35 + 1) = (short)uVar33 + -0x7f00;
            pbVar35 = pbVar35 + 3;
          }
          local_180 = &(pZVar15->entropy).fse;
          if (psVar9 == sequences) {
            memcpy(local_180,&(pZVar7->entropy).fse,0xde0);
LAB_0010d7c6:
            uVar12 = (long)pbVar35 - (long)dst;
            if (uVar12 == 0) goto LAB_0010d7e8;
          }
          else {
            local_1a0 = (pZVar15->entropy).fse.litlengthCTable;
            puVar34 = (ulong *)(pbVar35 + 1);
            ZSTD_seqToCodes(seqStore);
            max = 0x23;
            sVar37 = 0x10d3bf;
            sVar26 = HIST_countFast_wksp(count,&max,local_198,uVar33,pUVar20,0x1800);
            (pZVar15->entropy).fse.litlength_repeatMode = (pZVar7->entropy).fse.litlength_repeatMode
            ;
            pFVar1 = (pZVar7->entropy).fse.litlengthCTable;
            sVar10 = ZSTD_selectEncodingType
                               (&(pZVar15->entropy).fse.litlength_repeatMode,count,max,sVar26,uVar33
                                ,9,pFVar1,LL_defaultNorm,6,ZSTD_defaultAllowed,
                                (ZSTD_strategy)local_188);
            uVar12 = ZSTD_buildCTable(puVar34,(long)dst + (dstCapacity - (long)puVar34),local_1a0,9,
                                      sVar10,count,max,local_198,uVar33,LL_defaultNorm,6,0x23,pFVar1
                                      ,0x524,pUVar20,sVar37);
            if (uVar12 < 0xffffffffffffff89) {
              puVar32 = (ulong *)(uVar12 + (long)puVar34);
              prevCTable = &(pZVar7->entropy).fse;
              max = 0x1f;
              sVar37 = 0x10d4e5;
              local_190 = sVar10;
              sVar26 = HIST_countFast_wksp(count,&max,pBVar23,uVar33,pUVar20,0x1800);
              (pZVar15->entropy).fse.offcode_repeatMode = (pZVar7->entropy).fse.offcode_repeatMode;
              sVar10 = ZSTD_selectEncodingType
                                 (&(pZVar15->entropy).fse.offcode_repeatMode,count,max,sVar26,uVar33
                                  ,8,prevCTable->offcodeCTable,OF_defaultNorm,5,(uint)(max < 0x1d),
                                  (ZSTD_strategy)local_188);
              uVar12 = ZSTD_buildCTable(puVar32,(long)dst + (dstCapacity - (long)puVar32),
                                        local_180->offcodeCTable,8,sVar10,count,max,pBVar23,uVar33,
                                        OF_defaultNorm,5,0x1c,prevCTable->offcodeCTable,0x304,
                                        pUVar20,sVar37);
              if (uVar12 < 0xffffffffffffff89) {
                puVar14 = (ulong *)(uVar12 + (long)puVar32);
                puVar27 = (ulong *)0x0;
                if (local_190 == set_compressed) {
                  puVar27 = puVar34;
                }
                if (sVar10 == set_compressed) {
                  puVar27 = puVar32;
                }
                pFVar1 = (pZVar15->entropy).fse.matchlengthCTable;
                _max = CONCAT44(uStack_1c4,0x34);
                sVar37 = 0x10d61c;
                local_170 = (ulong)sVar10;
                sVar26 = HIST_countFast_wksp(count,&max,codeTable,uVar33,pUVar20,0x1800);
                (pZVar15->entropy).fse.matchlength_repeatMode =
                     (pZVar7->entropy).fse.matchlength_repeatMode;
                prevCTable_00 = (pZVar7->entropy).fse.matchlengthCTable;
                sVar10 = ZSTD_selectEncodingType
                                   (&(pZVar15->entropy).fse.matchlength_repeatMode,count,max,sVar26,
                                    uVar33,9,prevCTable_00,ML_defaultNorm,6,ZSTD_defaultAllowed,
                                    (ZSTD_strategy)local_188);
                uVar12 = ZSTD_buildCTable(puVar14,(long)dst + (dstCapacity - (long)puVar14),pFVar1,9
                                          ,sVar10,count,(U32)_max,codeTable,uVar33,ML_defaultNorm,6,
                                          0x34,prevCTable_00,0x5ac,pUVar20,sVar37);
                puVar34 = (ulong *)((long)puVar14 + uVar12);
                puVar22 = puVar14;
                puVar32 = puVar27;
                if (uVar12 < 0xffffffffffffff89) {
                  puVar22 = puVar34;
                  puVar32 = puVar14;
                }
                if (sVar10 != set_compressed) {
                  puVar32 = puVar27;
                }
                if (uVar12 < 0xffffffffffffff89) {
                  *pbVar35 = (char)((int)local_170 << 4) + (char)(local_190 << 6) +
                             (char)sVar10 * '\x04';
                  sVar26 = (long)dst + (dstCapacity - (long)puVar34);
                  if ((int)local_178 == 0) {
                    puVar27 = (ulong *)((long)puVar34 + (sVar26 - 8));
                    if (sVar26 < 9) {
                      uVar12 = 0xffffffffffffffba;
                    }
                    else {
                      local_1b8 = puVar34;
                      local_1a8 = puVar27;
                      FSE_initCState2(&stateMatchLength,pFVar1,(uint)codeTable[uVar33 - 1]);
                      FSE_initCState2(&stateOffsetBits,local_180->offcodeCTable,
                                      (uint)pBVar23[uVar33 - 1]);
                      pBVar8 = local_198;
                      FSE_initCState2(&local_168,local_1a0,(uint)local_198[uVar33 - 1]);
                      uVar17 = LL_bits[pBVar8[uVar33 - 1]];
                      _max = (ulong)((uint)sequences[uVar33 - 1].matchLength &
                                    BIT_mask[ML_bits[codeTable[uVar33 - 1]]]) <<
                             ((byte)uVar17 & 0x3f) |
                             (ulong)((uint)sequences[uVar33 - 1].litLength & BIT_mask[uVar17]);
                      uVar17 = ML_bits[codeTable[uVar33 - 1]] + uVar17;
                      if (local_18c < 0x3a) {
                        _max = (ulong)(BIT_mask[pBVar23[uVar33 - 1]] & sequences[uVar33 - 1].offset)
                               << ((byte)uVar17 & 0x3f) | _max;
                        uVar30 = uVar17 + pBVar23[uVar33 - 1];
                      }
                      else {
                        uVar30 = (uint)pBVar23[uVar33 - 1];
                        puVar14 = puVar34;
                        if (uVar30 < 0x38) {
                          UVar29 = sequences[uVar33 - 1].offset;
                          bVar16 = 0;
                        }
                        else {
                          uVar24 = 0;
                          UVar29 = sequences[uVar33 - 1].offset;
                          if (uVar30 != 0x38) {
                            uVar24 = (ulong)(uVar30 - 0x38);
                            _max = (ulong)(BIT_mask[uVar24] & UVar29) << ((byte)uVar17 & 0x3f) |
                                   _max;
                            uVar17 = (uVar30 + uVar17) - 0x38;
                            puVar14 = (ulong *)((ulong)(uVar17 >> 3) + (long)puVar34);
                            if (puVar27 < puVar14) {
                              puVar14 = puVar27;
                            }
                            *puVar34 = _max;
                            _max = _max >> ((byte)uVar17 & 0x38);
                            uVar17 = uVar17 & 7;
                          }
                          bVar16 = (byte)uVar24;
                          uVar30 = 0x38;
                        }
                        _max = (ulong)(UVar29 >> (bVar16 & 0x1f) & BIT_mask[uVar30]) <<
                               ((byte)uVar17 & 0x3f) | _max;
                        uVar30 = uVar30 + uVar17;
                        puVar34 = puVar14;
                      }
                      local_1b0 = (ulong *)((ulong)(uVar30 >> 3) + (long)puVar34);
                      if (puVar27 < local_1b0) {
                        local_1b0 = puVar27;
                      }
                      *puVar34 = _max;
                      _max = _max >> ((byte)uVar30 & 0x38);
                      for (uVar24 = uVar33 - 2; local_1c0 = uVar30 & 7, uVar24 < uVar33;
                          uVar24 = uVar24 - 1) {
                        bVar16 = local_198[uVar24];
                        bVar2 = pBVar23[uVar24];
                        uVar12 = (ulong)bVar2;
                        uVar30 = (uint)bVar2;
                        bVar3 = codeTable[uVar24];
                        uVar17 = LL_bits[bVar16];
                        uVar11 = ML_bits[bVar3];
                        FSE_encodeSymbol((BIT_CStream_t *)&max,&stateOffsetBits,(uint)bVar2);
                        FSE_encodeSymbol((BIT_CStream_t *)&max,&stateMatchLength,(uint)bVar3);
                        FSE_encodeSymbol((BIT_CStream_t *)&max,&local_168,(uint)bVar16);
                        uVar21 = uVar11 + uVar17 + bVar2;
                        uVar25 = local_1c0;
                        if (0x1e < uVar21) {
                          *local_1b0 = _max;
                          local_1b0 = (ulong *)((ulong)(local_1c0 >> 3) + (long)local_1b0);
                          if (local_1a8 < local_1b0) {
                            local_1b0 = local_1a8;
                          }
                          uVar25 = local_1c0 & 7;
                          _max = _max >> ((byte)local_1c0 & 0x38);
                        }
                        _max = (ulong)((uint)sequences[uVar24].matchLength & BIT_mask[uVar11]) <<
                               ((byte)(uVar25 + uVar17) & 0x3f) |
                               (ulong)((uint)sequences[uVar24].litLength & BIT_mask[uVar17]) <<
                               ((byte)uVar25 & 0x3f) | _max;
                        uVar11 = uVar11 + uVar25 + uVar17;
                        uVar17 = uVar11;
                        if (0x38 < uVar21) {
                          *local_1b0 = _max;
                          local_1b0 = (ulong *)((ulong)(uVar11 >> 3) + (long)local_1b0);
                          if (local_1a8 < local_1b0) {
                            local_1b0 = local_1a8;
                          }
                          uVar17 = uVar11 & 7;
                          _max = _max >> ((byte)uVar11 & 0x38);
                        }
                        if (local_18c < 0x3a) {
                          uVar11 = BIT_mask[uVar12] & sequences[uVar24].offset;
                        }
                        else {
                          if (bVar2 < 0x38) {
                            UVar29 = sequences[uVar24].offset;
                            bVar16 = 0;
                          }
                          else {
                            uVar12 = 0;
                            UVar29 = sequences[uVar24].offset;
                            if (bVar2 != 0x38) {
                              uVar12 = (ulong)(bVar2 - 0x38);
                              _max = (ulong)(BIT_mask[uVar12] & UVar29) << ((byte)uVar17 & 0x3f) |
                                     _max;
                              uVar17 = (uVar17 + bVar2) - 0x38;
                              *local_1b0 = _max;
                              local_1b0 = (ulong *)((ulong)(uVar17 >> 3) + (long)local_1b0);
                              if (local_1a8 < local_1b0) {
                                local_1b0 = local_1a8;
                              }
                              _max = _max >> ((byte)uVar17 & 0x38);
                              uVar17 = uVar17 & 7;
                            }
                            bVar16 = (byte)uVar12;
                            uVar12 = 0x38;
                          }
                          uVar30 = (uint)uVar12;
                          uVar11 = UVar29 >> (bVar16 & 0x1f) & BIT_mask[uVar12];
                        }
                        _max = (ulong)uVar11 << ((byte)uVar17 & 0x3f) | _max;
                        uVar30 = uVar30 + uVar17;
                        *local_1b0 = _max;
                        local_1b0 = (ulong *)((ulong)(uVar30 >> 3) + (long)local_1b0);
                        if (local_1a8 < local_1b0) {
                          local_1b0 = local_1a8;
                        }
                        _max = _max >> ((byte)uVar30 & 0x38);
                      }
                      FSE_flushCState((BIT_CStream_t *)&max,&stateMatchLength);
                      FSE_flushCState((BIT_CStream_t *)&max,&stateOffsetBits);
                      FSE_flushCState((BIT_CStream_t *)&max,&local_168);
                      sVar26 = BIT_closeCStream((BIT_CStream_t *)&max);
                      uVar12 = 0xffffffffffffffba;
                      if (sVar26 != 0) {
                        uVar12 = sVar26;
                      }
                    }
                  }
                  else {
                    uVar12 = ZSTD_encodeSequences_bmi2
                                       (puVar34,sVar26,pFVar1,codeTable,local_180->offcodeCTable,
                                        pBVar23,local_1a0,local_198,sequences,uVar33,(uint)bVar36);
                  }
                  if (uVar12 < 0xffffffffffffff89) {
                    pbVar35 = (byte *)((long)puVar22 + uVar12);
                    if ((puVar32 != (ulong *)0x0) && ((long)pbVar35 - (long)puVar32 < 4))
                    goto LAB_0010d7e8;
                    goto LAB_0010d7c6;
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((dstCapacity < srcSize) || (uVar12 != 0xffffffffffffffba)) {
      if (uVar12 < 0xffffffffffffff89) {
        ZVar4 = (zc->appliedParams).cParams.strategy;
        bVar16 = 6;
        if (ZSTD_btopt < ZVar4) {
          bVar16 = (char)ZVar4 - 1;
        }
        if ((srcSize - (srcSize >> (bVar16 & 0x3f))) - 2 <= uVar12) {
          uVar12 = 0;
        }
      }
      pZVar7 = (zc->blockState).prevCBlock;
      pZVar15 = pZVar7;
      if (uVar12 - 1 < 0xffffffffffffff88) {
        pZVar15 = (zc->blockState).nextCBlock;
        (zc->blockState).prevCBlock = pZVar15;
        (zc->blockState).nextCBlock = pZVar7;
      }
      goto LAB_0010d7f2;
    }
  }
LAB_0010d7e8:
  uVar12 = 0;
  pZVar15 = (zc->blockState).prevCBlock;
LAB_0010d7f2:
  if ((pZVar15->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar15->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return uVar12;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}